

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_6::LineBufferTask::LineBufferTask
          (LineBufferTask_conflict *this,TaskGroup *group,Data *ifd,LineBuffer *lineBuffer,
          int scanLineMin,int scanLineMax,OptimizationMode optimizationMode)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  TaskGroup *in_RSI;
  Task *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_stack_00000008;
  
  IlmThread_2_5::Task::Task(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__LineBufferTask_00441770;
  *(undefined8 *)(in_RDI + 0x10) = in_RDX;
  *(undefined8 *)(in_RDI + 0x18) = in_RCX;
  *(undefined4 *)(in_RDI + 0x20) = in_R8D;
  *(undefined4 *)(in_RDI + 0x24) = in_R9D;
  *(undefined8 *)(in_RDI + 0x28) = in_stack_00000008;
  return;
}

Assistant:

LineBufferTask::LineBufferTask
    (TaskGroup *group,
     ScanLineInputFile::Data *ifd,
     LineBuffer *lineBuffer,
     int scanLineMin,
     int scanLineMax,OptimizationMode optimizationMode)
:
    Task (group),
    _ifd (ifd),
    _lineBuffer (lineBuffer),
    _scanLineMin (scanLineMin),
    _scanLineMax (scanLineMax),
    _optimizationMode(optimizationMode)
{
    // empty
}